

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper_2.cpp
# Opt level: O2

uint8_t __thiscall n_e_s::core::Mapper2::cpu_read_byte(Mapper2 *this,uint16_t addr)

{
  InvalidAddress *this_00;
  long lStack_20;
  
  if ((short)addr < -0x4000) {
    lStack_20 = 0x18;
  }
  else {
    if (addr < 0xc000) {
      this_00 = (InvalidAddress *)__cxa_allocate_exception(0x28);
      InvalidAddress::InvalidAddress(this_00,addr);
      __cxa_throw(this_00,&InvalidAddress::typeinfo,InvalidAddress::~InvalidAddress);
    }
    lStack_20 = 0x19;
  }
  return (this->prg_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start
         [addr & 0x3fff | (uint)(this->super_IRom).header_.nes[lStack_20 + -8] << 0xe];
}

Assistant:

uint8_t Mapper2::cpu_read_byte(uint16_t addr) const {
    if (addr >= kSwitchablePrgRomStart && addr <= kSwitchablePrgRomEnd) {
        const uint32_t mapped_addr =
                select_bank_low_ * 0x4000u + (addr & 0x3FFFu);
        return prg_rom_[mapped_addr];
    }

    if (addr >= kLastBankPrgRomStart) {
        const uint32_t mapped_addr =
                select_bank_hi_ * 0x4000u + (addr & 0x3FFFu);
        return prg_rom_[mapped_addr];
    }

    throw InvalidAddress(addr);
}